

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::crate::CrateReader::UnpackInlinedValueRep
          (CrateReader *this,ValueRep *rep,CrateValue *value)

{
  ulong uVar1;
  half hVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char cVar4;
  CrateDataTypeId did;
  CrateDataTypeId did_00;
  long lVar7;
  char cVar8;
  char *pcVar9;
  char *pcVar10;
  undefined1 *puVar11;
  array<tinyusdz::value::half,_4UL> aVar12;
  crate *this_00;
  optional<tinyusdz::Token> v_3;
  string str_1;
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tyRet;
  ostringstream ss_e;
  undefined1 local_240 [24];
  undefined1 local_228 [20];
  float local_214;
  string local_210;
  undefined1 local_1f0 [32];
  char local_1d0;
  undefined1 local_1c8 [4];
  undefined4 uStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1b8;
  _Alloc_hider _Stack_1a8;
  double local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_198;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  double dStack_168;
  double dStack_160;
  double dStack_158;
  double local_150;
  string local_50;
  char cVar5;
  Index token_index;
  int iVar6;
  
  if ((rep->data >> 0x3e & 1) == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"UnpackInlinedValueRep",0x15);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x71b);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"ValueRep must be inlined value representation.",0x2e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,local_1f0._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._0_8_ !=
        &(((anon_union_32_2_293c120a_for_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
            *)local_1f0)->m_error).field_2) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    ::std::ios_base::~ios_base((ios_base *)&dStack_158);
    return (bool)'\0';
  }
  GetCrateDataType_abi_cxx11_
            ((expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&((anon_union_32_2_293c120a_for_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                   *)local_1f0)->m_value,(crate *)(rep->data >> 0x30 & 0xff),(int32_t)value);
  if (local_1d0 == '\0') {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"UnpackInlinedValueRep",0x15);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x721);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    if (local_1d0 == '\x01') {
      __assert_fail("! has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/expected.hpp"
                    ,0x87c,
                    "const error_type &nonstd::expected_lite::expected<tinyusdz::crate::CrateDataType, std::basic_string<char>>::error() const & [T = tinyusdz::crate::CrateDataType, E = std::basic_string<char>]"
                   );
    }
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,(char *)local_1f0._0_8_,
                        CONCAT44(local_1f0._12_4_,local_1f0._8_4_));
    goto LAB_001c8c4e;
  }
  uVar1 = rep->data;
  if ((uVar1 >> 0x3d & 1) != 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"UnpackInlinedValueRep",0x15);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x726);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar10 = "Inlinved value must not be compressed.";
    lVar7 = 0x26;
    goto LAB_001c8c37;
  }
  if ((long)uVar1 < 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"UnpackInlinedValueRep",0x15);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x72b);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar10 = "Inlined value must not be an array.";
    lVar7 = 0x23;
    goto LAB_001c8c37;
  }
  this_00 = (crate *)(ulong)(uint)local_1f0._8_4_;
  if ((crate *)0x39 < this_00) goto LAB_001c8cb9;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&switchD_001c895e::switchdataD_005fc3a4 +
         (long)(int)(&switchD_001c895e::switchdataD_005fc3a4)[(long)this_00]);
  cVar4 = (char)uVar1;
  token_index.value = (uint32_t)uVar1;
  iVar6 = (int)token_index.value >> 0x18;
  cVar8 = (char)(uVar1 >> 8);
  cVar5 = (char)(uVar1 >> 0x10);
  switch(this_00) {
  case (crate *)0x0:
  case (crate *)0x39:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"UnpackInlinedValueRep",0x15);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x739);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar10 = "`Invalid` DataType.";
    lVar7 = 0x13;
    goto LAB_001c8c37;
  case (crate *)0x1:
    local_1c8[0] = token_index.value != 0;
    linb::any::operator=((any *)value,(bool *)local_1c8);
    break;
  case (crate *)0x2:
    _local_1c8 = (_Type)(CONCAT44(uStack_1c4,token_index.value) & 0xffffffff000000ff);
    goto LAB_001c944a;
  case (crate *)0x3:
    local_1c8._0_2_ = (short)token_index.value;
    local_1c8._2_2_ = (short)(token_index.value >> 0x10);
LAB_001c944a:
    linb::any::operator=((any *)value,(int *)local_1c8);
    break;
  case (crate *)0x4:
    local_1c8._0_2_ = (short)token_index.value;
    local_1c8._2_2_ = (short)(token_index.value >> 0x10);
    linb::any::operator=((any *)value,(uint *)local_1c8);
    break;
  case (crate *)0x5:
    _local_1c8 = (_Type)(long)(int)token_index.value;
    linb::any::operator=((any *)value,(long *)local_1c8);
    break;
  case (crate *)0x6:
    _local_1c8 = (_Type)(uVar1 & 0xffffffff);
    linb::any::operator=((any *)value,(unsigned_long *)local_1c8);
    break;
  case (crate *)0x7:
    local_1c8._0_2_ = (uint16_t)uVar1;
    linb::any::operator=((any *)value,(half *)local_1c8);
    break;
  case (crate *)0x8:
    local_1c8._0_2_ = (short)token_index.value;
    local_1c8._2_2_ = (short)(token_index.value >> 0x10);
    linb::any::operator=((any *)value,(float *)local_1c8);
    break;
  case (crate *)0x9:
    _local_1c8 = (_Type)(double)(float)token_index.value;
    linb::any::operator=((any *)value,(double *)local_1c8);
    break;
  case (crate *)0xa:
    GetStringToken((optional<tinyusdz::Token> *)local_240,this,token_index);
    cVar8 = local_240[0];
    if (local_240[0] == true) {
      _local_1c8 = (_Type)&aStack_1b8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,local_240._8_8_,
                 (undefined1 *)(local_240._16_8_ + local_240._8_8_));
      linb::any::operator=
                ((any *)value,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
      goto LAB_001c92e2;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"UnpackInlinedValueRep",0x15);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x765);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar10 = "Invalid Index for StringToken.";
    lVar7 = 0x1e;
LAB_001c9a65:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar10,lVar7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_210._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,
                      (ulong)(local_210.field_2._M_allocated_capacity + 1));
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    ::std::ios_base::~ios_base((ios_base *)&dStack_158);
    goto LAB_001c9ae7;
  case (crate *)0xb:
    GetToken((optional<tinyusdz::Token> *)local_240,this,token_index);
    cVar8 = local_240[0];
    if (local_240[0] != true) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"UnpackInlinedValueRep",0x15);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x757);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar10 = "Invalid Index for Token.";
      lVar7 = 0x18;
      goto LAB_001c9a65;
    }
    _local_1c8 = (_Type)&aStack_1b8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c8,local_240._8_8_,
               (undefined1 *)(local_240._16_8_ + local_240._8_8_));
    linb::any::operator=((any *)value,(Token *)local_1c8);
LAB_001c92e2:
    local_210.field_2._M_allocated_capacity = aStack_1b8._M_allocated_capacity;
    aVar12._M_elems = _local_1c8;
    if (_local_1c8 != (_Type)&aStack_1b8) goto LAB_001c95c8;
    goto LAB_001c9ae7;
  case (crate *)0xc:
    GetToken((optional<tinyusdz::Token> *)local_240,this,token_index);
    cVar8 = local_240[0];
    if (local_240[0] != true) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"UnpackInlinedValueRep",0x15);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x749);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar10 = "Invalid Index for AssetPath.";
      lVar7 = 0x1c;
      goto LAB_001c9a65;
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,local_240._8_8_,
               (undefined1 *)(local_240._16_8_ + local_240._8_8_));
    _local_1c8 = (_Type)&aStack_1b8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c8,local_210._M_dataplus._M_p,
               local_210._M_dataplus._M_p + local_210._M_string_length);
    _Stack_1a8._M_p = (pointer)&aStack_198;
    local_1a0 = 0.0;
    aStack_198._M_allocated_capacity = aStack_198._M_allocated_capacity & 0xffffffffffffff00;
    linb::any::operator=((any *)value,(AssetPath *)local_1c8);
    tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_1c8);
    aVar12._M_elems = (_Type)local_210._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p == &local_210.field_2) goto LAB_001c9ae7;
LAB_001c95c8:
    operator_delete((void *)aVar12._M_elems,
                    (ulong)((long)&(((_Link_type)local_210.field_2._M_allocated_capacity)->
                                   super__Rb_tree_node_base)._M_color + 1));
LAB_001c9ae7:
    if ((local_240[0] == true) && ((undefined1 *)local_240._8_8_ != local_228)) {
      operator_delete((void *)local_240._8_8_,local_228._0_8_ + 1);
    }
    goto LAB_001c8cbb;
  case (crate *)0xd:
    _fStack_1c0 = 0.0;
    aStack_1b8._M_allocated_capacity = 0;
    _local_1c8 = (_Type)(double)(int)cVar4;
    aStack_1b8._8_8_ = (undefined8)(int)cVar8;
    linb::any::operator=((any *)value,(matrix2d *)local_1c8);
    break;
  case (crate *)0xe:
    _fStack_1c0 = 0.0;
    local_1a0 = 0.0;
    aStack_1b8._M_allocated_capacity = 0;
    aStack_1b8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    aStack_198._M_allocated_capacity = 0;
    aStack_198._8_8_ = 0.0;
    _local_1c8 = (_Type)(double)(int)cVar4;
    _Stack_1a8._M_p = (pointer)(double)(int)cVar8;
    local_188 = (double)(int)cVar5;
    linb::any::operator=((any *)value,(matrix3d *)local_1c8);
    break;
  case (crate *)0xf:
    aStack_198._M_allocated_capacity = 0;
    aStack_198._8_8_ = 0.0;
    _fStack_1c0 = 0.0;
    _Stack_1a8._M_p = (pointer)0x0;
    dStack_170 = 0.0;
    dStack_158 = 0.0;
    local_188 = 0.0;
    dStack_180 = 0.0;
    aStack_1b8._M_allocated_capacity = 0;
    aStack_1b8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    dStack_168 = 0.0;
    dStack_160 = 0.0;
    _local_1c8 = (_Type)(double)(int)cVar4;
    local_1a0 = (double)(int)cVar8;
    local_178 = (double)(int)cVar5;
    local_150 = (double)iVar6;
    linb::any::operator=((any *)value,(matrix4d *)local_1c8);
    break;
  case (crate *)0x10:
  case (crate *)0x11:
  case (crate *)0x12:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"UnpackInlinedValueRep",0x15);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x81e);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar10 = "Quaternion type is not allowed for Inlined Value.";
    lVar7 = 0x31;
LAB_001c8c37:
    poVar3 = (ostream *)local_1c8;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar10,lVar7);
LAB_001c8c4e:
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,CONCAT71(local_240._1_7_,local_240[0]));
    puVar11 = (undefined1 *)CONCAT71(local_240._1_7_,local_240[0]);
    if (puVar11 != local_240 + 0x10) {
LAB_001c8c8b:
      operator_delete(puVar11,local_240._16_8_ + 1);
    }
LAB_001c8c98:
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    ::std::ios_base::~ios_base((ios_base *)&dStack_158);
LAB_001c8cb9:
    cVar8 = '\0';
    goto LAB_001c8cbb;
  case (crate *)0x13:
    _local_1c8 = (_Type)(double)(int)cVar4;
    _fStack_1c0 = (undefined8)(int)cVar8;
    linb::any::operator=((any *)value,(array<double,_2UL> *)local_1c8);
    break;
  case (crate *)0x14:
    uStack_1c4 = (float)(int)cVar8;
    local_1c8 = (undefined1  [4])(float)(int)cVar4;
    linb::any::operator=((any *)value,(array<float,_2UL> *)local_1c8);
    break;
  case (crate *)0x15:
    hVar2 = tinyusdz::value::float_to_half_full((float)(int)cVar4);
    local_1c8._0_2_ = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full((float)(int)cVar8);
    local_1c8._2_2_ = hVar2.value;
    goto LAB_001c980f;
  case (crate *)0x16:
    uStack_1c4 = (float)(int)cVar8;
    local_1c8 = (undefined1  [4])(int)cVar4;
    linb::any::operator=((any *)value,(array<int,_2UL> *)local_1c8);
    break;
  case (crate *)0x17:
    _local_1c8 = (_Type)(double)(int)cVar4;
    _fStack_1c0 = (undefined8)(int)cVar8;
    aStack_1b8._M_allocated_capacity = (size_type)(double)(int)cVar5;
    linb::any::operator=((any *)value,(array<double,_3UL> *)local_1c8);
    break;
  case (crate *)0x18:
    uStack_1c4 = (float)(int)cVar8;
    local_1c8 = (undefined1  [4])(float)(int)cVar4;
    fStack_1c0 = (float)(int)cVar5;
    linb::any::operator=((any *)value,(array<float,_3UL> *)local_1c8);
    break;
  case (crate *)0x19:
    hVar2 = tinyusdz::value::float_to_half_full((float)(int)cVar4);
    local_1c8._0_2_ = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full((float)(int)cVar8);
    local_1c8._2_2_ = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full((float)(int)cVar5);
    uStack_1c4._0_2_ = hVar2.value;
LAB_001c980f:
    linb::any::operator=((any *)value,(array<tinyusdz::value::half,_3UL> *)local_1c8);
    break;
  case (crate *)0x1a:
    uStack_1c4 = (float)(int)cVar8;
    local_1c8 = (undefined1  [4])(int)cVar4;
    fStack_1c0 = (float)(int)cVar5;
    linb::any::operator=((any *)value,(array<int,_3UL> *)local_1c8);
    break;
  case (crate *)0x1b:
    _local_1c8 = (_Type)(double)(int)cVar4;
    _fStack_1c0 = (undefined8)(int)cVar8;
    aStack_1b8._M_allocated_capacity = (size_type)(double)(int)cVar5;
    aStack_1b8._8_8_ = (undefined8)iVar6;
    linb::any::operator=((any *)value,(array<double,_4UL> *)local_1c8);
    break;
  case (crate *)0x1c:
    uStack_1c4 = (float)(int)cVar8;
    local_1c8 = (undefined1  [4])(float)(int)cVar4;
    fStack_1bc = (float)iVar6;
    fStack_1c0 = (float)(int)cVar5;
    linb::any::operator=((any *)value,(array<float,_4UL> *)local_1c8);
    break;
  case (crate *)0x1d:
    local_214 = (float)(int)cVar4;
    hVar2 = tinyusdz::value::float_to_half_full(local_214);
    local_1c8._0_2_ = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full(local_214);
    local_1c8._2_2_ = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full(local_214);
    uStack_1c4._0_2_ = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full(local_214);
    uStack_1c4._2_2_ = hVar2.value;
    linb::any::operator=((any *)value,(array<tinyusdz::value::half,_4UL> *)local_1c8);
    break;
  case (crate *)0x1e:
    uStack_1c4 = (float)(int)cVar8;
    local_1c8 = (undefined1  [4])(int)cVar4;
    fStack_1bc = (float)iVar6;
    fStack_1c0 = (float)(int)cVar5;
    linb::any::operator=((any *)value,(array<int,_4UL> *)local_1c8);
    break;
  case (crate *)0x1f:
    aStack_1b8._8_8_ = &fStack_1c0;
    _fStack_1c0 = (ulong)(uint)fStack_1bc << 0x20;
    aStack_1b8._M_allocated_capacity = 0;
    local_1a0 = 0.0;
    _Stack_1a8._M_p = (pointer)aStack_1b8._8_8_;
    linb::any::operator=
              ((any *)value,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                *)local_1c8);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                *)local_1c8,(_Link_type)aStack_1b8._M_allocated_capacity);
    break;
  case (crate *)0x20:
  case (crate *)0x21:
  case (crate *)0x22:
  case (crate *)0x23:
  case (crate *)0x24:
  case (crate *)0x25:
  case (crate *)0x26:
  case (crate *)0x27:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"UnpackInlinedValueRep",0x15);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x8f8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar9 = "ListOp data type `{}` cannot be inlined.";
    pcVar10 = "";
    goto LAB_001c8db1;
  default:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"UnpackInlinedValueRep",0x15);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x904);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar9 = "Data type `{}` cannot be inlined.";
    pcVar10 = "";
LAB_001c8db1:
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,pcVar9,pcVar10);
    GetCrateDataTypeName_abi_cxx11_(&local_50,this_00,did);
    fmt::format<std::__cxx11::string>
              ((string *)local_240,(fmt *)&local_210,(string *)&local_50,args);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,(char *)CONCAT71(local_240._1_7_,local_240[0]),
                        local_240._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((undefined1 *)CONCAT71(local_240._1_7_,local_240[0]) != local_240 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_240._1_7_,local_240[0]),local_240._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
LAB_001c8e4c:
      operator_delete(local_210._M_dataplus._M_p,
                      (ulong)(local_210.field_2._M_allocated_capacity + 1));
    }
LAB_001c8e59:
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,CONCAT71(local_240._1_7_,local_240[0]));
    puVar11 = (undefined1 *)CONCAT71(local_240._1_7_,local_240[0]);
    if (puVar11 != local_240 + 0x10) goto LAB_001c8c8b;
    goto LAB_001c8c98;
  case (crate *)0x2a:
    if (2 < token_index.value) {
LAB_001c986b:
      ::std::__cxx11::string::append((char *)&this->_err);
      goto LAB_001c8cb9;
    }
    local_1c8._0_2_ = (short)token_index.value;
    local_1c8._2_2_ = (short)(token_index.value >> 0x10);
    linb::any::operator=((any *)value,(Specifier *)local_1c8);
    break;
  case (crate *)0x2b:
    if (1 < token_index.value) goto LAB_001c986b;
    local_1c8._0_2_ = (short)token_index.value;
    local_1c8._2_2_ = (short)(token_index.value >> 0x10);
    linb::any::operator=((any *)value,(Permission *)local_1c8);
    break;
  case (crate *)0x2c:
    if (2 < token_index.value) goto LAB_001c986b;
    local_1c8._0_2_ = (short)token_index.value;
    local_1c8._2_2_ = (short)(token_index.value >> 0x10);
    linb::any::operator=((any *)value,(Variability *)local_1c8);
    break;
  case (crate *)0x33:
    CrateValue::Set(value,(ValueBlock *)local_1c8);
    break;
  case (crate *)0x34:
  case (crate *)0x35:
  case (crate *)0x36:
  case (crate *)0x38:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"UnpackInlinedValueRep",0x15);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x90d);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    GetCrateDataTypeName_abi_cxx11_(&local_210,this_00,did_00);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                     "Invalid data type(or maybe not supported in TinyUSDZ yet) for Inlined value: "
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_210);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,(char *)CONCAT71(local_240._1_7_,local_240[0]),
                        local_240._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((undefined1 *)CONCAT71(local_240._1_7_,local_240[0]) != local_240 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_240._1_7_,local_240[0]),local_240._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) goto LAB_001c8e4c;
    goto LAB_001c8e59;
  }
  cVar8 = '\x01';
LAB_001c8cbb:
  if ((local_1d0 == '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._0_8_ !=
      &(((anon_union_32_2_293c120a_for_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
          *)local_1f0)->m_error).field_2)) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  return (bool)cVar8;
}

Assistant:

bool CrateReader::UnpackInlinedValueRep(const crate::ValueRep &rep,
                                        crate::CrateValue *value) {
  if (!rep.IsInlined()) {
    PUSH_ERROR("ValueRep must be inlined value representation.");
    return false;
  }

  const auto tyRet = crate::GetCrateDataType(rep.GetType());
  if (!tyRet) {
    PUSH_ERROR(tyRet.error());
    return false;
  }

  if (rep.IsCompressed()) {
    PUSH_ERROR("Inlinved value must not be compressed.");
    return false;
  }

  if (rep.IsArray()) {
    PUSH_ERROR("Inlined value must not be an array.");
    return false;
  }

  const auto dty = tyRet.value();
  DCOUT(crate::GetCrateDataTypeRepr(dty));

  uint32_t d = (rep.GetPayload() & ((1ull << (sizeof(uint32_t) * 8)) - 1));
  DCOUT("d = " << d);

  // TODO(syoyo): Use template SFINE?
  switch (dty.dtype_id) {
    case crate::CrateDataTypeId::NumDataTypes:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INVALID: {
      PUSH_ERROR("`Invalid` DataType.");
      return false;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_BOOL: {
      value->Set(d ? true : false);
      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_ASSET_PATH: {
      // AssetPath = TokenIndex for inlined value.
      if (auto v = GetToken(crate::Index(d))) {
        std::string str = v.value().str();

        value::AssetPath assetp(str);
        value->Set(assetp);
        return true;
      } else {
        PUSH_ERROR("Invalid Index for AssetPath.");
        return false;
      }
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TOKEN: {
      if (auto v = GetToken(crate::Index(d))) {
        value::token tok = v.value();

        DCOUT("value.token = " << tok);

        value->Set(tok);

        return true;
      } else {
        PUSH_ERROR("Invalid Index for Token.");
        return false;
      }
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_STRING: {
      if (auto v = GetStringToken(crate::Index(d))) {
        std::string str = v.value().str();

        DCOUT("value.string = " << str);

        value->Set(str);

        return true;
      } else {
        PUSH_ERROR("Invalid Index for StringToken.");
        return false;
      }
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_SPECIFIER: {
      if (d >= static_cast<int>(Specifier::Invalid)) {
        _err += "Invalid value for Specifier\n";
        return false;
      }
      Specifier val = static_cast<Specifier>(d);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PERMISSION: {
      if (d >= static_cast<int>(Permission::Invalid)) {
        _err += "Invalid value for Permission\n";
        return false;
      }
      Permission val = static_cast<Permission>(d);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VARIABILITY: {
      if (d >= static_cast<int>(Variability::Invalid)) {
        _err += "Invalid value for Variability\n";
        return false;
      }
      Variability val = static_cast<Variability>(d);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UCHAR: {
      uint8_t val;
      memcpy(&val, &d, 1);

      DCOUT("value.uchar = " << val);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INT: {
      int ival;
      memcpy(&ival, &d, sizeof(int));

      DCOUT("value.int = " << ival);

      value->Set(ival);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UINT: {
      uint32_t val;
      memcpy(&val, &d, sizeof(uint32_t));

      DCOUT("value.uint = " << val);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INT64: {
      // stored as int
      int _ival;
      memcpy(&_ival, &d, sizeof(int));

      DCOUT("value.int = " << _ival);

      int64_t ival = static_cast<int64_t>(_ival);

      value->Set(ival);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UINT64: {
      // stored as uint32
      uint32_t _ival;
      memcpy(&_ival, &d, sizeof(uint32_t));

      DCOUT("value.int = " << _ival);

      uint64_t ival = static_cast<uint64_t>(_ival);

      value->Set(ival);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_HALF: {
      value::half f;
      memcpy(&f, &d, sizeof(value::half));

      DCOUT("value.half = " << f);

      value->Set(f);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_FLOAT: {
      float f;
      memcpy(&f, &d, sizeof(float));

      DCOUT("value.float = " << f);

      value->Set(f);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE: {
      // stored as float
      float _f;
      memcpy(&_f, &d, sizeof(float));

      double f = static_cast<double>(_f);

      value->Set(f);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_MATRIX2D: {
      // Matrix contains diagnonal components only, and values are represented
      // in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::matrix2d v;
      memset(v.m, 0, sizeof(value::matrix2d));
      v.m[0][0] = static_cast<double>(data[0]);
      v.m[1][1] = static_cast<double>(data[1]);

      DCOUT("value.matrix(diag) = " << v.m[0][0] << ", " << v.m[1][1] << "\n");

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_MATRIX3D: {
      // Matrix contains diagnonal components only, and values are represented
      // in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::matrix3d v;
      memset(v.m, 0, sizeof(value::matrix3d));
      v.m[0][0] = static_cast<double>(data[0]);
      v.m[1][1] = static_cast<double>(data[1]);
      v.m[2][2] = static_cast<double>(data[2]);

      DCOUT("value.matrix(diag) = " << v.m[0][0] << ", " << v.m[1][1] << ", "
                                    << v.m[2][2] << "\n");

      value->Set(v);

      return true;
    }

    case crate::CrateDataTypeId::CRATE_DATA_TYPE_MATRIX4D: {
      // Matrix contains diagnonal components only, and values are represented
      // in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::matrix4d v;
      memset(v.m, 0, sizeof(value::matrix4d));
      v.m[0][0] = static_cast<double>(data[0]);
      v.m[1][1] = static_cast<double>(data[1]);
      v.m[2][2] = static_cast<double>(data[2]);
      v.m[3][3] = static_cast<double>(data[3]);

      DCOUT("value.matrix(diag) = " << v.m[0][0] << ", " << v.m[1][1] << ", "
                                    << v.m[2][2] << ", " << v.m[3][3]);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_QUATD:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_QUATF:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_QUATH: {
      // Seems quaternion type is not allowed for Inlined Value.
      PUSH_ERROR("Quaternion type is not allowed for Inlined Value.");
      return false;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC2D: {
      // Value is represented in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::double2 v;
      v[0] = double(data[0]);
      v[1] = double(data[1]);

      DCOUT("value.double2 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC2F: {
      // Value is represented in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::float2 v;
      v[0] = float(data[0]);
      v[1] = float(data[1]);

      DCOUT("value.float2 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC2H: {
      // Value is represented in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::half3 v;
      v[0] = value::float_to_half_full(float(data[0]));
      v[1] = value::float_to_half_full(float(data[1]));

      DCOUT("value.half2 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC2I: {
      // Value is represented in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::int2 v;
      v[0] = int(data[0]);
      v[1] = int(data[1]);

      DCOUT("value.int2 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC3D: {
      // Value is represented in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::double3 v;
      v[0] = double(data[0]);
      v[1] = double(data[1]);
      v[2] = double(data[2]);

      DCOUT("value.double3 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC3F: {
      // Value is represented in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::float3 v;
      v[0] = float(data[0]);
      v[1] = float(data[1]);
      v[2] = float(data[2]);

      DCOUT("value.float3 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC3H: {
      // Value is represented in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::half3 v;
      v[0] = value::float_to_half_full(float(data[0]));
      v[1] = value::float_to_half_full(float(data[1]));
      v[2] = value::float_to_half_full(float(data[2]));

      DCOUT("value.half3 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC3I: {
      // Value is represented in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::int3 v;
      v[0] = static_cast<int32_t>(data[0]);
      v[1] = static_cast<int32_t>(data[1]);
      v[2] = static_cast<int32_t>(data[2]);

      DCOUT("value.int3 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC4D: {
      // Value is represented in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::double4 v;
      v[0] = static_cast<double>(data[0]);
      v[1] = static_cast<double>(data[1]);
      v[2] = static_cast<double>(data[2]);
      v[3] = static_cast<double>(data[3]);

      DCOUT("value.doublef = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC4F: {
      // Value is represented in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::float4 v;
      v[0] = static_cast<float>(data[0]);
      v[1] = static_cast<float>(data[1]);
      v[2] = static_cast<float>(data[2]);
      v[3] = static_cast<float>(data[3]);

      DCOUT("value.vec4f = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC4H: {
      // Value is represented in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::half4 v;
      v[0] = value::float_to_half_full(float(data[0]));
      v[1] = value::float_to_half_full(float(data[0]));
      v[2] = value::float_to_half_full(float(data[0]));
      v[3] = value::float_to_half_full(float(data[0]));

      DCOUT("value.vec4h = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC4I: {
      // Value is represented in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::int4 v;
      v[0] = static_cast<int32_t>(data[0]);
      v[1] = static_cast<int32_t>(data[1]);
      v[2] = static_cast<int32_t>(data[2]);
      v[3] = static_cast<int32_t>(data[3]);

      DCOUT("value.vec4i = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_DICTIONARY: {
      // empty dict is allowed
      // TODO: empty(zero value) check?
      //crate::CrateValue::Dictionary dict;
      CustomDataType dict; // use CustomDataType for Dict
      value->Set(dict);
      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VALUE_BLOCK: {
      // Guess No content for ValueBlock
      value::ValueBlock block;
      value->Set(block);
      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TOKEN_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_STRING_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PATH_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_REFERENCE_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INT_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INT64_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UINT_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UINT64_LIST_OP: {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("ListOp data type `{}` cannot be inlined.",
          crate::GetCrateDataTypeName(dty.dtype_id)));
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PATH_VECTOR:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TOKEN_VECTOR:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VARIANT_SELECTION_MAP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TIME_SAMPLES:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE_VECTOR:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PAYLOAD:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PAYLOAD_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_LAYER_OFFSET_VECTOR:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_STRING_VECTOR: {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Data type `{}` cannot be inlined.",
          crate::GetCrateDataTypeName(dty.dtype_id)));
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VALUE:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UNREGISTERED_VALUE:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UNREGISTERED_VALUE_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TIME_CODE: {
      PUSH_ERROR(
          "Invalid data type(or maybe not supported in TinyUSDZ yet) for "
          "Inlined value: " +
          crate::GetCrateDataTypeName(dty.dtype_id));
      return false;
    }
  }

  // Should never reach here.
  return false;
}